

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

FTexture * __thiscall FFont::GetChar(FFont *this,int code,int *width)

{
  FTexture *local_38;
  int local_24;
  int xmove;
  int *width_local;
  int code_local;
  FFont *this_local;
  
  width_local._4_4_ = GetCharCode(this,code,false);
  local_24 = this->SpaceWidth;
  if (-1 < width_local._4_4_) {
    width_local._4_4_ = width_local._4_4_ - this->FirstChar;
    local_24 = this->Chars[width_local._4_4_].XMove;
    if ((this->Chars[width_local._4_4_].Pic == (FTexture *)0x0) &&
       (width_local._4_4_ = GetCharCode(this,width_local._4_4_ + this->FirstChar,true),
       -1 < width_local._4_4_)) {
      width_local._4_4_ = width_local._4_4_ - this->FirstChar;
      local_24 = this->Chars[width_local._4_4_].XMove;
    }
  }
  if (width != (int *)0x0) {
    *width = local_24;
  }
  if (width_local._4_4_ < 0) {
    local_38 = (FTexture *)0x0;
  }
  else {
    local_38 = this->Chars[width_local._4_4_].Pic;
  }
  return local_38;
}

Assistant:

FTexture *FFont::GetChar (int code, int *const width) const
{
	code = GetCharCode(code, false);
	int xmove = SpaceWidth;

	if (code >= 0)
	{
		code -= FirstChar;
		xmove = Chars[code].XMove;
		if (Chars[code].Pic == NULL)
		{
			code = GetCharCode(code + FirstChar, true);
			if (code >= 0)
			{
				code -= FirstChar;
				xmove = Chars[code].XMove;
			}
		}
	}
	if (width != NULL)
	{
		*width = xmove;
	}
	return (code < 0) ? NULL : Chars[code].Pic;
}